

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall DropdownMenu::addMenuButton(DropdownMenu *this,TextButton *menuButton)

{
  RectangleShape *this_00;
  float fVar1;
  float fVar2;
  pointer pTVar3;
  Vector2f *pVVar4;
  Vector2f *pVVar5;
  uint uVar6;
  RectangleShape *pRVar7;
  Vector2f newBackgroundSize;
  Vector2f local_38;
  Vector2f local_30;
  
  std::vector<TextButton,_std::allocator<TextButton>_>::push_back(&this->menuButtons,menuButton);
  pTVar3 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &this->background;
  pVVar4 = sf::Transformable::getPosition(&(this->background).super_Shape.super_Transformable);
  pVVar5 = sf::RectangleShape::getSize(this_00);
  local_30.y = pVVar5->y + -2.0 + (*pVVar4).y;
  local_30.x = (*pVVar4).x + 2.0;
  sf::Transformable::setPosition(&pTVar3[-1].super_UIComponent.super_Transformable,&local_30);
  pVVar4 = sf::RectangleShape::getSize(this_00);
  fVar1 = pVVar4->x;
  pVVar4 = sf::RectangleShape::getSize(this_00);
  fVar2 = pVVar4->y;
  pRVar7 = &menuButton->button;
  pVVar4 = sf::RectangleShape::getSize(pRVar7);
  local_30.y = fVar2 + pVVar4->y;
  local_30.x = fVar1;
  pVVar4 = sf::RectangleShape::getSize(pRVar7);
  fVar2 = pVVar4->x;
  pVVar4 = sf::RectangleShape::getSize(pRVar7);
  if (fVar2 + 4.0 <= fVar1) {
    fVar1 = this->maxMenuButtonWidth;
    if (pVVar4->x < fVar1) {
      pTVar3 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pVVar4 = sf::RectangleShape::getSize(pRVar7);
      local_38.y = pVVar4->y;
      local_38.x = fVar1;
      sf::RectangleShape::setSize(&pTVar3[-1].button,&local_38);
    }
  }
  else {
    local_30.x = pVVar4->x + 4.0;
    pVVar4 = sf::RectangleShape::getSize(pRVar7);
    this->maxMenuButtonWidth = pVVar4->x;
    for (uVar6 = (int)(((long)(this->menuButtons).
                              super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->menuButtons).
                             super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x3b0) - 2; -1 < (int)uVar6;
        uVar6 = uVar6 - 1) {
      pRVar7 = &(this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6].button;
      fVar1 = this->maxMenuButtonWidth;
      pVVar4 = sf::RectangleShape::getSize(pRVar7);
      local_38.y = pVVar4->y;
      local_38.x = fVar1;
      sf::RectangleShape::setSize(pRVar7,&local_38);
    }
  }
  sf::RectangleShape::setSize(this_00,&local_30);
  return;
}

Assistant:

void DropdownMenu::addMenuButton(const TextButton& menuButton) {
    menuButtons.push_back(menuButton);
    menuButtons.back().setPosition(background.getPosition() + Vector2f(2.0f, background.getSize().y - 2.0f));
    Vector2f newBackgroundSize(background.getSize().x, background.getSize().y + menuButton.button.getSize().y);
    if (newBackgroundSize.x < menuButton.button.getSize().x + 4.0f) {
        newBackgroundSize.x = menuButton.button.getSize().x + 4.0f;
        maxMenuButtonWidth = menuButton.button.getSize().x;
        for (int i = menuButtons.size() - 2; i >= 0; --i) {
            menuButtons[i].button.setSize(Vector2f(maxMenuButtonWidth, menuButtons[i].button.getSize().y));
        }
    } else if (menuButton.button.getSize().x < maxMenuButtonWidth) {
        menuButtons.back().button.setSize(Vector2f(maxMenuButtonWidth, menuButton.button.getSize().y));
    }
    background.setSize(newBackgroundSize);
}